

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  anon_class_24_3_43158b25 l;
  size_t agents_count;
  suffix_t local_28;
  unsigned_long local_20;
  
  local_20 = 0;
  l.agents_count = &local_20;
  l.this = this;
  l.mbox = mbox;
  prio::
  for_each_priority<so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::priority_t)_1_>
            (l);
  local_28 = stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&this->m_base_prefix,&local_28,&local_20);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						std::size_t agents_count = 0;

						so_5::prio::for_each_priority( [&]( priority_t p ) {
								auto agents = m_dispatcher.m_agents_per_priority[
										to_size_t(p) ].load( std::memory_order_acquire );

								agents_count += agents;

								distribute_value_for_work_thread(
										mbox,
										p,
										agents,
										*(m_dispatcher.m_threads[ to_size_t(p) ]) );
							} );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agents_count );
					}